

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_c.cpp
# Opt level: O0

void csscal(int n,float sa,complex<float> *cx,int incx)

{
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  int local_20;
  int i;
  int incx_local;
  complex<float> *cx_local;
  float sa_local;
  int n_local;
  
  if ((0 < n) && (0 < incx)) {
    cx_local._0_4_ = sa;
    cx_local._4_4_ = n;
    if (incx == 1) {
      for (local_20 = 0; local_20 < cx_local._4_4_; local_20 = local_20 + 1) {
        std::operator*((float *)&cx_local,cx + local_20);
        cx[local_20]._M_value = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      }
    }
    else {
      for (local_20 = 0; local_20 < cx_local._4_4_; local_20 = local_20 + 1) {
        std::operator*((float *)&cx_local,cx + local_20 * incx);
        cx[local_20 * incx]._M_value = CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
      }
    }
  }
  return;
}

Assistant:

void csscal ( int n, float sa, complex <float> cx[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    CSSCAL scales a vector by a real constant.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, float SA, the multiplier.
//
//    Input/output, complex <float> CX[], the vector to be scaled.
//
//    Input, int INCX, the increment between successive entries of
//    the vector CX.
//
{
  int i;

  if ( n <= 0 || incx <= 0 )
  {
    return;
  }

  if ( incx == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      cx[i] = sa * cx[i];
    }
  }
  else
  {
    for ( i = 0; i < n; i++ )
    {
      cx[i*incx] = sa * cx[i*incx];
    }
  }
  return;
}